

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  bad_alloc *a;
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  undefined1 local_2a8 [8];
  fmcalc fc;
  string local_140 [39];
  allocator local_119;
  string local_118 [32];
  undefined1 local_f8 [8];
  sigaction sa;
  bool local_4d;
  bool local_4c;
  bool local_4b;
  bool local_4a;
  bool local_49;
  string local_48 [3];
  bool stepped;
  bool netvalue;
  bool generalOptimization;
  bool allocruleOptimizationOff;
  bool debug;
  string inputpath;
  uint local_20;
  int opt;
  int allocrule;
  int new_max;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  opt = -1;
  local_20 = 0;
  std::__cxx11::string::string(local_48);
  local_49 = false;
  local_4a = false;
  local_4b = true;
  local_4c = false;
  local_4d = false;
  while (iVar2 = getopt(argc,argv,"SdnovhOM:p:a:"), iVar2 != -1) {
    switch(iVar2) {
    case 0x4d:
      opt = atoi(_optarg);
      break;
    default:
      help();
      exit(1);
    case 0x4f:
      local_4a = true;
      break;
    case 0x53:
      local_4d = true;
      break;
    case 0x61:
      local_20 = atoi(_optarg);
      break;
    case 100:
      local_49 = true;
      break;
    case 0x68:
      help();
      exit(1);
    case 0x6e:
      local_4c = true;
      break;
    case 0x6f:
      local_4b = false;
      break;
    case 0x70:
      std::__cxx11::string::operator=(local_48,_optarg);
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      exit(1);
    }
  }
  memset(local_f8,0,0x98);
  sigemptyset((sigset_t *)&sa);
  local_f8 = (undefined1  [8])segfault_sigaction;
  sa.sa_mask.__val[0xf]._0_4_ = 4;
  sigaction(0xb,(sigaction *)local_f8,(sigaction *)0x0);
  if ((-1 < (int)local_20) && ((int)local_20 < 4)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"",&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"",(allocator *)&fc.field_0x15f);
    initstreams((string *)local_118,(string *)local_140);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&fc.field_0x15f);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    fmcalc::fmcalc((fmcalc *)local_2a8,opt,local_20,(string *)local_48,local_4c,local_49,local_4a,
                   local_4b,local_4d);
    pcVar1 = progname;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,pcVar1,&local_2c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f0,"INFO",&local_2f1);
    logprintf((string *)local_2c8,(string *)local_2f0,"starting process..\n");
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    fmcalc::doit((fmcalc *)local_2a8);
    pcVar1 = progname;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_318,pcVar1,&local_319);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_340,"INFO",(allocator *)((long)&a + 7));
    logprintf((string *)local_318,(string *)local_340,"finishing process..\n");
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator((allocator<char> *)((long)&a + 7));
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    fmcalc::~fmcalc((fmcalc *)local_2a8);
    std::__cxx11::string::~string(local_48);
    return 0;
  }
  fprintf(_stderr,"FATAL:%s: Invalid allocrule %d\n",progname,(ulong)local_20);
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
    int new_max = -1;
	int allocrule = 0;
	int opt;
	std::string inputpath;
	bool debug = false;
	bool allocruleOptimizationOff = false;
	bool generalOptimization = true;

	bool netvalue = false;
	bool stepped = false;
    while ((opt = getopt(argc, argv, "SdnovhOM:p:a:")) != -1) {
        switch (opt) {
		case 'o':
			generalOptimization = false;
			break;
		case 'O':
			allocruleOptimizationOff = true;
			break;
		case 'd':
			debug = true;
			break;
         case 'M':
            new_max = atoi(optarg);
            break;
		 case 'a':
			 allocrule = atoi(optarg);
			 break;
		 case 'v':
			 fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			 exit(EXIT_FAILURE);
			 break;
		 case 'p':
			 inputpath = optarg;
			 break;
		 case 'n':
			 netvalue = true;
			 break;
		 case 'S':
			 stepped = true;
			 break;
        case 'h':
           help();
           exit(EXIT_FAILURE);
        default:
            help();
            exit(EXIT_FAILURE);
        }
    }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	if (allocrule < 0 || allocrule > 3) {
		fprintf(stderr, "FATAL:%s: Invalid allocrule %d\n", progname,allocrule);
		exit(EXIT_FAILURE);
	}

	try {
		initstreams("", "");
		fmcalc fc(new_max, allocrule, inputpath, netvalue,debug, allocruleOptimizationOff, generalOptimization,stepped);
        logprintf(progname, "INFO", "starting process..\n");
		fc.doit();
        logprintf(progname, "INFO", "finishing process..\n");
	}
	catch (const std::bad_alloc &a) {
		fprintf(stderr, "FATAL:%s: bad_alloc: %s\n", progname, a.what());
		exit(EXIT_FAILURE);
	}

	return EXIT_SUCCESS;
}